

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_guardedTests.cpp
# Opt level: O0

void __thiscall
ordered_guarded_ordered_guarded_2_Test::ordered_guarded_ordered_guarded_2_Test
          (ordered_guarded_ordered_guarded_2_Test *this)

{
  ordered_guarded_ordered_guarded_2_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ordered_guarded_ordered_guarded_2_Test_00208a48;
  return;
}

Assistant:

TEST(ordered_guarded, ordered_guarded_2)
{
    ordered_guarded<int, shared_mutex> data(0);

    std::atomic<bool> th1_ok(true);
    std::atomic<bool> th2_ok(true);
    std::atomic<bool> th3_ok(true);
    std::atomic<bool> th4_ok(true);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            data.modify([](int& value) { ++value; });
        }
    });

    std::thread th2([&data, &th2_ok]() {
        for (int i = 0; i < 100000; ++i) {
            int check_i = data.modify([i](int& value) {
                ++value;
                return i;
            });
            if (check_i != i) {
                th2_ok = false;
            }
        }
    });

    std::thread th3([&data, &th3_ok]() {
        int last_val = 0;
        while (last_val != 200000) {
            auto data_handle = data.lock_shared();
            if (last_val > *data_handle) {
                th3_ok = false;
            }
            last_val = *data_handle;
        }
    });

    std::thread th4([&data, &th4_ok]() {
        int last_val = 0;
        while (last_val != 200000) {
            int new_data = data.read([](const int& value) { return value; });
            if (last_val > new_data) {
                th4_ok = false;
            }
            last_val = new_data;
        }
    });

    th1.join();
    th2.join();

    {
        auto data_handle = data.lock_shared();

        EXPECT_EQ(*data_handle, 200000);
    }

    th3.join();
    th4.join();

    EXPECT_TRUE(th1_ok == true);
    EXPECT_TRUE(th2_ok == true);
    EXPECT_TRUE(th3_ok == true);
    EXPECT_TRUE(th4_ok == true);

    EXPECT_EQ(data.modify([](const int& value) { return value; }), 200000);
}